

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

mat4 * __thiscall Camera::get_view(mat4 *__return_storage_ptr__,Camera *this)

{
  vec<3,_float,_(glm::qualifier)0> *in_R8;
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_3c;
  vec<3,_float,_(glm::qualifier)0> local_30;
  undefined8 local_20;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_18;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  vVar1 = glm::cross<float,(glm::qualifier)0>(&this->right,&this->direction);
  local_30.field_2 = vVar1.field_2;
  local_18 = local_30.field_2;
  local_30._0_8_ = vVar1._0_8_;
  local_20._0_4_ = local_30.field_0;
  local_20._4_4_ = local_30.field_1;
  (this->up).field_2 = local_30.field_2;
  (this->up).field_0 = local_30.field_0;
  (this->up).field_1 = local_30.field_1;
  local_30 = vVar1;
  vVar1 = glm::operator+(&this->position,&this->direction);
  local_50._0_8_ = vVar1._0_8_;
  local_3c.field_0 = local_50.field_0;
  local_3c.field_1 = local_50.field_1;
  local_50.field_2 = vVar1.field_2;
  local_3c.field_2 = local_50.field_2;
  glm::lookAt<float,(glm::qualifier)0>(__return_storage_ptr__,(glm *)this,&local_3c,&this->up,in_R8)
  ;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::get_view() {
    up = glm::cross(right, direction);
    return glm::lookAt(
        position,
        position+direction,
        up
    );
}